

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O1

void __thiscall
spdlog::details::F_formatter<spdlog::details::null_scoped_padder>::format
          (F_formatter<spdlog::details::null_scoped_padder> *this,log_msg *msg,tm *param_2,
          memory_buf_t *dest)

{
  long lVar1;
  uint uVar2;
  char *__src;
  ptrdiff_t _Num;
  size_t sVar3;
  duration duration;
  ulong uVar4;
  ulong uVar5;
  format_int local_50;
  
  uVar4 = (msg->time).__d.__r % 1000000000;
  lVar1 = 0x3f;
  if ((uVar4 | 1) != 0) {
    for (; (uVar4 | 1) >> lVar1 == 0; lVar1 = lVar1 + -1) {
    }
  }
  uVar2 = ((uint)lVar1 ^ 0xffffffc0) * 0x4d1 + 0x13911 >> 0xc;
  uVar2 = (uVar2 + 1) -
          (uint)(uVar4 < *(ulong *)(fmt::v6::internal::basic_data<void>::zero_or_powers_of_10_64 +
                                   (ulong)uVar2 * 8));
  if (uVar2 < 9) {
    sVar3 = 9 - (ulong)uVar2;
    uVar5 = (dest->super_buffer<char>).size_ + sVar3;
    if ((dest->super_buffer<char>).capacity_ < uVar5) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest,uVar5);
    }
    if ((ulong)uVar2 != 9) {
      memcpy((dest->super_buffer<char>).ptr_ + (dest->super_buffer<char>).size_,
             "0000000000000000000",sVar3);
    }
    (dest->super_buffer<char>).size_ = uVar5;
  }
  __src = fmt::v6::format_int::format_decimal(&local_50,uVar4);
  sVar3 = (long)(local_50.buffer_ + 0x15) - (long)__src;
  uVar4 = (dest->super_buffer<char>).size_ + sVar3;
  local_50.str_ = __src;
  if ((dest->super_buffer<char>).capacity_ < uVar4) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest,uVar4);
  }
  if (local_50.buffer_ + 0x15 != __src) {
    memmove((dest->super_buffer<char>).ptr_ + (dest->super_buffer<char>).size_,__src,sVar3);
  }
  (dest->super_buffer<char>).size_ = uVar4;
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override
    {
        auto ns = fmt_helper::time_fraction<std::chrono::nanoseconds>(msg.time);
        const size_t field_size = 9;
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::pad9(static_cast<size_t>(ns.count()), dest);
    }